

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t stream_recv(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream,char *buf,size_t len,
                   CURLcode *err)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode CVar3;
  ssize_t sVar4;
  
  pvVar1 = cf->ctx;
  *err = CURLE_AGAIN;
  _Var2 = Curl_bufq_is_empty(&stream->recvbuf);
  sVar4 = -1;
  if ((!_Var2) && (sVar4 = Curl_bufq_read(&stream->recvbuf,(uchar *)buf,len,err), sVar4 < 0))
  goto LAB_0063e1e5;
  if (sVar4 < 0) {
    if (stream->closed == true) {
      if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
          ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] returning CLOSE",(ulong)(uint)stream->id);
      }
      sVar4 = http2_handle_stream_close(cf,data,stream,err);
      goto LAB_0063e1e5;
    }
    if (((stream->reset == false) &&
        (((*(byte *)((long)pvVar1 + 200) & 1) == 0 ||
         (_Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x18)), !_Var2)))) &&
       ((sVar4 = -1, (*(byte *)((long)pvVar1 + 200) & 2) == 0 ||
        (stream->id <= *(int *)((long)pvVar1 + 0xc4))))) goto LAB_0063e1e5;
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"[%d] returning ERR",(ulong)(uint)stream->id);
    }
    CVar3 = CURLE_RECV_ERROR;
    if (stream->bodystarted != false) {
      CVar3 = CURLE_PARTIAL_FILE;
    }
    *err = CVar3;
  }
  else {
    if (sVar4 != 0) goto LAB_0063e1e5;
    *err = CURLE_AGAIN;
  }
  sVar4 = -1;
LAB_0063e1e5:
  if ((((sVar4 < 0) && (data != (Curl_easy *)0x0 && *err != CURLE_AGAIN)) &&
      (cf != (Curl_cfilter *)0x0)) &&
     (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"[%d] stream_recv(len=%zu) -> %zd, %d",(ulong)(uint)stream->id,len,
                      sVar4,*err);
  }
  return sVar4;
}

Assistant:

static ssize_t stream_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                           struct stream_ctx *stream,
                           char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  ssize_t nread = -1;

  *err = CURLE_AGAIN;
  if(!Curl_bufq_is_empty(&stream->recvbuf)) {
    nread = Curl_bufq_read(&stream->recvbuf,
                           (unsigned char *)buf, len, err);
    if(nread < 0)
      goto out;
    DEBUGASSERT(nread > 0);
  }

  if(nread < 0) {
    if(stream->closed) {
      CURL_TRC_CF(data, cf, "[%d] returning CLOSE", stream->id);
      nread = http2_handle_stream_close(cf, data, stream, err);
    }
    else if(stream->reset ||
            (ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) ||
            (ctx->goaway && ctx->last_stream_id < stream->id)) {
      CURL_TRC_CF(data, cf, "[%d] returning ERR", stream->id);
      *err = stream->bodystarted? CURLE_PARTIAL_FILE : CURLE_RECV_ERROR;
      nread = -1;
    }
  }
  else if(nread == 0) {
    *err = CURLE_AGAIN;
    nread = -1;
  }

out:
  if(nread < 0 && *err != CURLE_AGAIN)
    CURL_TRC_CF(data, cf, "[%d] stream_recv(len=%zu) -> %zd, %d",
                stream->id, len, nread, *err);
  return nread;
}